

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::GetTargetDependInfoPath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *lang)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [55];
  undefined1 local_21;
  string *local_20;
  string *lang_local;
  cmNinjaTargetGenerator *this_local;
  string *path;
  
  local_21 = 0;
  local_20 = lang;
  lang_local = (string *)this;
  this_local = (cmNinjaTargetGenerator *)__return_storage_ptr__;
  psVar1 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[0xc])
            (local_58,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_58);
  std::__cxx11::string::~string(local_58);
  std::operator+(&local_98,"/",local_20);
  std::operator+(&local_78,&local_98,"DependInfo.json");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetTargetDependInfoPath(
  std::string const& lang) const
{
  std::string path = this->Makefile->GetCurrentBinaryDirectory();
  path += "/";
  path += this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
  path += "/" + lang + "DependInfo.json";
  return path;
}